

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMarkAsAdvancedCommand.cxx
# Opt level: O3

bool __thiscall
cmMarkAsAdvancedCommand::InitialPass
          (cmMarkAsAdvancedCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  bool bVar1;
  int iVar2;
  cmState *this_00;
  char *pcVar3;
  cmake *this_01;
  undefined8 extraout_RAX;
  pointer pbVar4;
  uint uVar5;
  ulong uVar6;
  string *key;
  char *__end;
  string local_98;
  uint local_74;
  char *local_70;
  cmCommand *local_68;
  string local_60;
  char *local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  pbVar4 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_68 = &this->super_cmCommand;
  if (pbVar4 == (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"called with incorrect number of arguments","");
    cmCommand::SetError(local_68,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
LAB_001f9845:
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
LAB_001f9852:
    bVar1 = false;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)pbVar4);
    if ((iVar2 == 0) ||
       (iVar2 = std::__cxx11::string::compare
                          ((char *)(args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start), iVar2 == 0)) {
      iVar2 = std::__cxx11::string::compare
                        ((char *)(args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
      local_70 = "1";
      if (iVar2 == 0) {
        local_70 = "0";
      }
      local_74 = 0x536c01;
      uVar5 = 1;
    }
    else {
      local_70 = "1";
      uVar5 = 0;
      local_74 = 0;
    }
    uVar6 = (ulong)uVar5;
    pbVar4 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    bVar1 = true;
    if (uVar6 < (ulong)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5)) {
      local_40 = local_70 + 1;
      local_38 = args;
      do {
        uVar5 = uVar5 + 1;
        key = pbVar4 + uVar6;
        this_00 = cmMakefile::GetState(local_68->Makefile);
        pcVar3 = cmState::GetCacheEntryValue(this_00,key);
        if (pcVar3 == (char *)0x0) {
          this_01 = cmMakefile::GetCMakeInstance(local_68->Makefile);
          cmake::AddCacheEntry(this_01,key,(char *)0x0,(char *)0x0,6);
          local_74 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
        }
        pcVar3 = cmState::GetCacheEntryValue(this_00,key);
        if (pcVar3 == (char *)0x0) {
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_98,"This should never happen...","");
          cmSystemTools::Error(&local_98);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p == &local_98.field_2) goto LAB_001f9852;
          goto LAB_001f9845;
        }
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"ADVANCED","");
        pcVar3 = cmState::GetCacheEntryProperty(this_00,key,&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if (pcVar3 == (char *)0x0 || (local_74 & 1) != 0) {
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"ADVANCED","");
          local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,local_70,local_40);
          cmState::SetCacheEntryProperty(this_00,key,&local_98,&local_60);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
        }
        uVar6 = (ulong)uVar5;
        pbVar4 = (local_38->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      } while (uVar6 < (ulong)((long)(local_38->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5
                              ));
      bVar1 = true;
    }
  }
  return bVar1;
}

Assistant:

bool cmMarkAsAdvancedCommand::InitialPass(std::vector<std::string> const& args,
                                          cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  unsigned int i = 0;
  const char* value = "1";
  bool overwrite = false;
  if (args[0] == "CLEAR" || args[0] == "FORCE") {
    overwrite = true;
    if (args[0] == "CLEAR") {
      value = "0";
    }
    i = 1;
  }
  for (; i < args.size(); ++i) {
    std::string const& variable = args[i];
    cmState* state = this->Makefile->GetState();
    if (!state->GetCacheEntryValue(variable)) {
      this->Makefile->GetCMakeInstance()->AddCacheEntry(
        variable, nullptr, nullptr, cmStateEnums::UNINITIALIZED);
      overwrite = true;
    }
    if (!state->GetCacheEntryValue(variable)) {
      cmSystemTools::Error("This should never happen...");
      return false;
    }
    if (!state->GetCacheEntryProperty(variable, "ADVANCED") || overwrite) {
      state->SetCacheEntryProperty(variable, "ADVANCED", value);
    }
  }
  return true;
}